

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O2

void kca_fpk(kca_joint *joint,ga_pose *x)

{
  uint __line;
  char *__assertion;
  
  if (joint == (kca_joint *)0x0) {
    __assertion = "joint";
    __line = 0xc;
  }
  else {
    if (x != (ga_pose *)0x0) {
      x->target_body = joint->target_body;
      x->reference_body = joint->reference_body;
      x->target_frame = joint->target_frame;
      x->reference_frame = joint->reference_frame;
      return;
    }
    __assertion = "x";
    __line = 0xd;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,__line,"void kca_fpk(const struct kca_joint *, struct ga_pose *)");
}

Assistant:

void kca_fpk(
        const struct kca_joint *joint,
        struct ga_pose *x)
{
    assert(joint);
    assert(x);

    x->target_body = joint->target_body;
    x->reference_body = joint->reference_body;
    x->target_frame = joint->target_frame;
    x->reference_frame = joint->reference_frame;
}